

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O2

Id __thiscall
spv::Builder::findCompositeConstant
          (Builder *this,Op typeClass,Op opcode,Id typeId,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *comps,size_t numMembers)

{
  Id *pIVar1;
  Instruction *this_00;
  int iVar2;
  Id IVar3;
  mapped_type *pmVar4;
  int i;
  long lVar5;
  long lVar6;
  long lVar7;
  Op local_48;
  Op local_44;
  size_t local_40;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_38;
  
  lVar5 = 0;
  local_40 = numMembers;
  local_38 = comps;
  do {
    local_44 = typeClass;
    pmVar4 = std::__detail::
             _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&this->groupedConstants,&local_44);
    lVar7 = (long)(int)((ulong)((long)(pmVar4->
                                      super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>
                                      )._M_impl.super__Vector_impl_data._M_finish -
                               (long)(pmVar4->
                                     super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>
                                     )._M_impl.super__Vector_impl_data._M_start) >> 3);
    if (lVar7 <= lVar5) {
      return 0;
    }
    local_48 = typeClass;
    pmVar4 = std::__detail::
             _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&this->groupedConstants,&local_48);
    this_00 = (pmVar4->super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>).
              _M_impl.super__Vector_impl_data._M_start[lVar5];
    if ((this_00->typeId == typeId) && (this_00->opCode == opcode)) {
      iVar2 = Instruction::getNumOperands(this_00);
      if (iVar2 == (int)local_40) {
        lVar6 = 0;
        do {
          iVar2 = Instruction::getNumOperands(this_00);
          if (iVar2 <= lVar6) {
            if (lVar7 <= lVar5) {
              return 0;
            }
            return this_00->resultId;
          }
          IVar3 = Instruction::getIdOperand(this_00,(int)lVar6);
          pIVar1 = (local_38->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                   _M_impl.super__Vector_impl_data._M_start + lVar6;
          lVar6 = lVar6 + 1;
        } while (IVar3 == *pIVar1);
      }
    }
    lVar5 = lVar5 + 1;
  } while( true );
}

Assistant:

Id Builder::findCompositeConstant(Op typeClass, Op opcode, Id typeId, const std::vector<Id>& comps, size_t numMembers)
{
    Instruction* constant = nullptr;
    bool found = false;
    for (int i = 0; i < (int)groupedConstants[typeClass].size(); ++i) {
        constant = groupedConstants[typeClass][i];

        if (constant->getTypeId() != typeId)
            continue;

        if (constant->getOpCode() != opcode) {
            continue;
        }

        if (constant->getNumOperands() != (int)numMembers)
            continue;

        // same contents?
        bool mismatch = false;
        for (int op = 0; op < constant->getNumOperands(); ++op) {
            if (constant->getIdOperand(op) != comps[op]) {
                mismatch = true;
                break;
            }
        }
        if (! mismatch) {
            found = true;
            break;
        }
    }

    return found ? constant->getResultId() : NoResult;
}